

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePrinter.cpp
# Opt level: O0

void __thiscall
slang::ast::TypePrinter::visit(TypePrinter *this,TypeAliasType *type,string_view overrideName)

{
  string_view str;
  bool bVar1;
  Symbol *in_RSI;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  __sv_type _Var2;
  string path;
  string downstreamOverrideName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_000008e0;
  TypePrinter *in_stack_000008e8;
  Symbol *in_stack_000008f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  Type *in_stack_ffffffffffffff60;
  FormatBuffer *in_stack_ffffffffffffff70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  Scope *in_stack_ffffffffffffff98;
  DeclaredType *in_stack_ffffffffffffffd0;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff70);
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_10);
  if (bVar1) {
    if (((in_RDI->_M_len & 0x100) == 0) && (*(int *)&in_RDI->_M_str != 1)) {
      in_stack_ffffffffffffff70 = (FormatBuffer *)Symbol::getParentScope(in_RSI);
      getLexicalPath_abi_cxx11_(in_stack_ffffffffffffff98);
      std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                (in_stack_ffffffffffffff80,in_RDI);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff60);
    }
    else {
      std::__cxx11::string::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff60,
                 (basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff58);
    }
  }
  else {
    std::__cxx11::string::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff60,
               (basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff58);
  }
  if ((in_RDI->_M_len & 0x100000000) == 0) {
    in_stack_ffffffffffffff60 = DeclaredType::getType(in_stack_ffffffffffffffd0);
    Symbol::visit<slang::ast::TypePrinter&,std::__cxx11::string&>
              (in_stack_000008f0,in_stack_000008e8,in_stack_000008e0);
  }
  else {
    std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::operator->
              ((unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_> *)
               0xc0c21d);
    _Var2 = std::__cxx11::string::operator_cast_to_basic_string_view
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffff60);
    str._M_str = (char *)_Var2._M_len;
    str._M_len = (size_t)in_RDI;
    FormatBuffer::append(in_stack_ffffffffffffff70,str);
  }
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff60);
  return;
}

Assistant:

void TypePrinter::visit(const TypeAliasType& type, std::string_view overrideName) {
    std::string downstreamOverrideName;
    if (!overrideName.empty()) {
        downstreamOverrideName = overrideName;
    }
    else if (options.elideScopeNames ||
             options.anonymousTypeStyle == TypePrintingOptions::FriendlyName) {
        downstreamOverrideName = type.name;
    }
    else {
        std::string path = getLexicalPath(type.getParentScope());
        path.append(type.name);
        downstreamOverrideName = path;
    }

    if (options.skipTypeDefs) {
        buffer->append(downstreamOverrideName);
    }
    else {
        type.targetType.getType().visit(*this, downstreamOverrideName);
    }
}